

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterDropShadow.cpp
# Opt level: O0

SharedPtr<Filter> __thiscall
Rml::FilterDropShadowInstancer::InstanceFilter
          (FilterDropShadowInstancer *this,String *param_1,PropertyDictionary *properties)

{
  bool bVar1;
  Colour<unsigned_char,_255,_false> in_color;
  Property *this_00;
  Property *this_01;
  Property *this_02;
  element_type *this_03;
  NumericValue in_offset_x;
  NumericValue in_offset_y;
  NumericValue in_sigma;
  PropertyDictionary *in_RCX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  SharedPtr<Filter> SVar3;
  undefined1 local_58 [8];
  SharedPtr<Rml::FilterDropShadow> decorator;
  Property *p_sigma;
  Property *p_offset_y;
  Property *p_offset_x;
  Property *p_color;
  PropertyDictionary *properties_local;
  String *param_1_local;
  FilterDropShadowInstancer *this_local;
  
  this_00 = PropertyDictionary::GetProperty(in_RCX,param_1[3].field_2._M_local_buf[8]);
  this_01 = PropertyDictionary::GetProperty(in_RCX,param_1[3].field_2._M_local_buf[9]);
  this_02 = PropertyDictionary::GetProperty(in_RCX,param_1[3].field_2._M_local_buf[10]);
  decorator.super___shared_ptr<Rml::FilterDropShadow,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         PropertyDictionary::GetProperty(in_RCX,param_1[3].field_2._M_local_buf[0xb]);
  if ((((this_00 == (Property *)0x0) || (this_01 == (Property *)0x0)) ||
      (this_02 == (Property *)0x0)) ||
     ((Property *)
      decorator.super___shared_ptr<Rml::FilterDropShadow,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi == (Property *)0x0)) {
    ::std::shared_ptr<Rml::Filter>::shared_ptr((shared_ptr<Rml::Filter> *)this,(nullptr_t)0x0);
    _Var2._M_pi = extraout_RDX;
  }
  else {
    MakeShared<Rml::FilterDropShadow>();
    this_03 = ::std::
              __shared_ptr_access<Rml::FilterDropShadow,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<Rml::FilterDropShadow,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_58);
    in_color = Property::Get<Rml::Colour<unsigned_char,255,false>>(this_00);
    in_offset_x = Property::GetNumericValue(this_01);
    in_offset_y = Property::GetNumericValue(this_02);
    in_sigma = Property::GetNumericValue
                         ((Property *)
                          decorator.
                          super___shared_ptr<Rml::FilterDropShadow,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi);
    bVar1 = FilterDropShadow::Initialise(this_03,in_color,in_offset_x,in_offset_y,in_sigma);
    if (bVar1) {
      ::std::shared_ptr<Rml::Filter>::shared_ptr<Rml::FilterDropShadow,void>
                ((shared_ptr<Rml::Filter> *)this,(shared_ptr<Rml::FilterDropShadow> *)local_58);
    }
    else {
      ::std::shared_ptr<Rml::Filter>::shared_ptr((shared_ptr<Rml::Filter> *)this,(nullptr_t)0x0);
    }
    ::std::shared_ptr<Rml::FilterDropShadow>::~shared_ptr
              ((shared_ptr<Rml::FilterDropShadow> *)local_58);
    _Var2._M_pi = extraout_RDX_00;
  }
  SVar3.super___shared_ptr<Rml::Filter,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var2._M_pi;
  SVar3.super___shared_ptr<Rml::Filter,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (SharedPtr<Filter>)SVar3.super___shared_ptr<Rml::Filter,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

SharedPtr<Filter> FilterDropShadowInstancer::InstanceFilter(const String& /*name*/, const PropertyDictionary& properties)
{
	const Property* p_color = properties.GetProperty(ids.color);
	const Property* p_offset_x = properties.GetProperty(ids.offset_x);
	const Property* p_offset_y = properties.GetProperty(ids.offset_y);
	const Property* p_sigma = properties.GetProperty(ids.sigma);
	if (!p_color || !p_offset_x || !p_offset_y || !p_sigma)
		return nullptr;

	auto decorator = MakeShared<FilterDropShadow>();
	if (decorator->Initialise(p_color->Get<Colourb>(), p_offset_x->GetNumericValue(), p_offset_y->GetNumericValue(), p_sigma->GetNumericValue()))
		return decorator;

	return nullptr;
}